

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::SetGlobalPropertyNoHost
               (char16 *propertyName,charcount_t propertyLength,Var value,
               ScriptContext *scriptContext)

{
  GlobalObject *this;
  IndexType IVar1;
  PropertyId propertyId;
  PropertyRecord *pPStack_48;
  IndexType indexType;
  PropertyRecord *propertyRecord;
  GlobalObject *pGStack_38;
  uint32 index;
  GlobalObject *globalObject;
  ScriptContext *scriptContext_local;
  Var value_local;
  char16 *pcStack_18;
  charcount_t propertyLength_local;
  char16 *propertyName_local;
  
  globalObject = (GlobalObject *)scriptContext;
  scriptContext_local = (ScriptContext *)value;
  value_local._4_4_ = propertyLength;
  pcStack_18 = propertyName;
  pGStack_38 = ScriptContextBase::GetGlobalObject(&scriptContext->super_ScriptContextBase);
  pPStack_48 = (PropertyRecord *)0x0;
  IVar1 = GetIndexTypeFromString
                    (pcStack_18,value_local._4_4_,(ScriptContext *)globalObject,
                     (uint32 *)((long)&propertyRecord + 4),&stack0xffffffffffffffb8,true);
  this = pGStack_38;
  if (IVar1 == IndexType_Number) {
    propertyName_local._4_4_ =
         DynamicObject::SetItem
                   ((DynamicObject *)pGStack_38,propertyRecord._4_4_,scriptContext_local,
                    PropertyOperation_None);
  }
  else {
    propertyId = PropertyRecord::GetPropertyId(pPStack_48);
    propertyName_local._4_4_ =
         DynamicObject::SetProperty
                   ((DynamicObject *)this,propertyId,scriptContext_local,PropertyOperation_None,
                    (PropertyValueInfo *)0x0);
  }
  return propertyName_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::SetGlobalPropertyNoHost(char16 const * propertyName, charcount_t propertyLength, Var value, ScriptContext * scriptContext)
    {
        GlobalObject * globalObject = scriptContext->GetGlobalObject();
        uint32 index;
        PropertyRecord const * propertyRecord = nullptr;
        IndexType indexType = GetIndexTypeFromString(propertyName, propertyLength, scriptContext, &index, &propertyRecord, true);

        if (indexType == IndexType_Number)
        {
            return globalObject->DynamicObject::SetItem(index, value, PropertyOperation_None);
        }
        return globalObject->DynamicObject::SetProperty(propertyRecord->GetPropertyId(), value, PropertyOperation_None, NULL);
    }